

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

int doctest::detail::callTestFunc(funcType f)

{
  (*f)();
  return (int)(getContextState::data->numFailedAssertionsForCurrentTestcase != 0);
}

Assistant:

int callTestFunc(funcType f) {
        int res = EXIT_SUCCESS;
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
            f();
            if(getContextState()->numFailedAssertionsForCurrentTestcase)
                res = EXIT_FAILURE;
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
        } catch(const TestFailureException&) { res = EXIT_FAILURE; } catch(...) {
            DOCTEST_LOG_START();
            logTestCrashed();
            res = EXIT_FAILURE;
        }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
        return res;
    }